

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS
ref_import_i_like_cfd_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FILE *pFVar6;
  void *pvVar7;
  char *pcVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  REF_INT n1;
  REF_INT n0;
  REF_INT nid;
  REF_INT n2;
  REF_INT new_cell;
  REF_INT nquad;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT n3;
  REF_INT new_node;
  REF_DBL y;
  REF_DBL x;
  REF_INT nodes [27];
  char line [1024];
  int local_4fc;
  int local_4f8;
  int local_4f4;
  FILE *local_4f0;
  int local_4e4;
  REF_INT local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  void *local_4d0;
  REF_GRID_conflict local_4c8;
  int local_4c0;
  int local_4bc;
  REF_DBL local_4b8;
  REF_DBL local_4b0;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  undefined4 local_498;
  char local_438 [1032];
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x514,
           "ref_import_i_like_cfd_grid",(ulong)uVar3,"create grid");
    return uVar3;
  }
  local_4c8 = *ref_grid_ptr;
  ref_node = local_4c8->node;
  local_4c8->twod = 1;
  pFVar6 = fopen(filename,"r");
  if (pFVar6 == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar8 = "unable to open file";
    uVar10 = 0x51c;
  }
  else {
    iVar4 = __isoc99_fscanf(pFVar6,"%d %d %d\n",&local_4d4,&local_4d8,&local_4dc);
    if (iVar4 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x51f,"ref_import_i_like_cfd_grid","read nnode ntri nquad",3,(long)iVar4);
      return 1;
    }
    if (0 < local_4d4) {
      lVar11 = 0;
      do {
        iVar4 = __isoc99_fscanf(pFVar6,"%lf %lf",&local_4b0,&local_4b8);
        if (iVar4 != 2) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x522,"ref_import_i_like_cfd_grid","read xy",2,(long)iVar4);
          return 1;
        }
        uVar3 = ref_node_add(ref_node,lVar11,&local_4bc);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x523,"ref_import_i_like_cfd_grid",(ulong)uVar3,"add node");
          return uVar3;
        }
        pRVar1 = ref_node->real;
        lVar9 = (long)local_4bc;
        pRVar1[lVar9 * 0xf] = local_4b0;
        pRVar1[lVar9 * 0xf + 1] = local_4b8;
        pRVar1[lVar9 * 0xf + 2] = 0.0;
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_4d4);
    }
    uVar3 = ref_node_initialize_n_global(ref_node,(long)local_4d4);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x528,"ref_import_i_like_cfd_grid",(ulong)uVar3,"init glob");
      return uVar3;
    }
    local_4f0 = pFVar6;
    if (0 < local_4d8) {
      iVar4 = 0;
      do {
        iVar5 = __isoc99_fscanf(local_4f0,"%d %d %d",&local_4f8,&local_4fc,&local_4e4);
        if (iVar5 != 3) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x52d,"ref_import_i_like_cfd_grid","read tri",3,(long)iVar5);
          return 1;
        }
        local_4a8 = local_4f8 + -1;
        local_4a4 = local_4fc + -1;
        local_4a0 = local_4e4 + -1;
        local_49c = 1;
        uVar3 = ref_cell_add(local_4c8->cell[3],&local_4a8,&local_4e0);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x533,"ref_import_i_like_cfd_grid",(ulong)uVar3,"tri face for tri");
          return uVar3;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_4d8);
    }
    if (0 < local_4dc) {
      iVar4 = 0;
      do {
        iVar5 = __isoc99_fscanf(local_4f0,"%d %d %d %d",&local_4f8,&local_4fc,&local_4e4,&local_4c0)
        ;
        if (iVar5 != 4) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x537,"ref_import_i_like_cfd_grid","read quad",4,(long)iVar5);
          return 1;
        }
        local_4a8 = local_4f8 + -1;
        local_4a4 = local_4fc + -1;
        local_4a0 = local_4e4 + -1;
        local_49c = local_4c0 + -1;
        local_498 = 1;
        uVar3 = ref_cell_add(local_4c8->cell[6],&local_4a8,&local_4e0);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x53e,"ref_import_i_like_cfd_grid",(ulong)uVar3,"quad face for qua");
          return uVar3;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_4dc);
    }
    iVar4 = __isoc99_fscanf(local_4f0,"%d\n",&local_4f4);
    if (iVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x541,"ref_import_i_like_cfd_grid","number of edge groups",1,(long)iVar4);
      return 1;
    }
    if ((long)local_4f4 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x542,"ref_import_i_like_cfd_grid","malloc count of REF_INT negative");
      return 1;
    }
    pvVar7 = malloc((long)local_4f4 << 2);
    local_4d0 = pvVar7;
    if (pvVar7 != (void *)0x0) {
      if (0 < local_4f4) {
        lVar11 = 0;
        do {
          iVar4 = __isoc99_fscanf(local_4f0,"%d\n",pvVar7);
          if (iVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x544,"ref_import_i_like_cfd_grid","elements in edge groups",1,(long)iVar4);
            return 1;
          }
          lVar11 = lVar11 + 1;
          pvVar7 = (void *)((long)pvVar7 + 4);
        } while (lVar11 < local_4f4);
      }
      if (0 < local_4f4) {
        lVar11 = 1;
        do {
          pcVar8 = fgets(local_438,0x400,local_4f0);
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "read line for first edge node";
            uVar10 = 0x547;
            goto LAB_0015b35e;
          }
          iVar4 = __isoc99_sscanf(local_438,"%d",&local_4f8);
          if (iVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x548,"ref_import_i_like_cfd_grid","first edge node",1,(long)iVar4);
            return 1;
          }
          if (1 < *(int *)((long)local_4d0 + lVar11 * 4 + -4)) {
            iVar4 = 1;
            do {
              pcVar8 = fgets(local_438,0x400,local_4f0);
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "read line for first edge node";
                uVar10 = 0x54a;
                goto LAB_0015b35e;
              }
              iVar5 = __isoc99_sscanf(local_438,"%d",&local_4fc);
              if (iVar5 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x54b,"ref_import_i_like_cfd_grid","next edge node",1,(long)iVar5);
                return 1;
              }
              local_4a8 = local_4f8 + -1;
              local_4a4 = local_4fc + -1;
              local_4a0 = (int)lVar11;
              uVar3 = ref_cell_add(local_4c8->cell[0],&local_4a8,&local_4e0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x550,"ref_import_i_like_cfd_grid",(ulong)uVar3,"add edge to edg");
                return uVar3;
              }
              local_4f8 = local_4fc;
              iVar4 = iVar4 + 1;
            } while (iVar4 < *(int *)((long)local_4d0 + lVar11 * 4 + -4));
          }
          bVar2 = lVar11 < local_4f4;
          lVar11 = lVar11 + 1;
        } while (bVar2);
      }
      free(local_4d0);
      fclose(local_4f0);
      return 0;
    }
    pcVar8 = "malloc count of REF_INT NULL";
    uVar10 = 0x542;
  }
LAB_0015b35e:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar10,
         "ref_import_i_like_cfd_grid",pcVar8);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_import_i_like_cfd_grid(REF_GRID *ref_grid_ptr,
                                                     REF_MPI ref_mpi,
                                                     const char *filename) {
  FILE *file;
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT node, new_node;
  REF_INT nnode, ntri, nquad;
  REF_INT new_cell, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id, nid, i;
  REF_INT *count;
  REF_INT n0, n1, n2, n3;
  REF_DBL x, y;
  char line[1024];

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(3, fscanf(file, "%d %d %d\n", &nnode, &ntri, &nquad),
       "read nnode ntri nquad");

  for (node = 0; node < nnode; node++) {
    REIS(2, fscanf(file, "%lf %lf", &x, &y), "read xy");
    RSS(ref_node_add(ref_node, node, &new_node), "add node");
    ref_node_xyz(ref_node, 0, new_node) = x;
    ref_node_xyz(ref_node, 1, new_node) = y;
    ref_node_xyz(ref_node, 2, new_node) = 0.0;
  }
  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  id = 1;

  for (cell = 0; cell < ntri; cell++) {
    REIS(3, fscanf(file, "%d %d %d", &n0, &n1, &n2), "read tri");
    nodes[0] = n0 - 1;
    nodes[1] = n1 - 1;
    nodes[2] = n2 - 1;
    nodes[3] = id;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell),
        "tri face for tri");
  }

  for (cell = 0; cell < nquad; cell++) {
    REIS(4, fscanf(file, "%d %d %d %d", &n0, &n1, &n2, &n3), "read quad");
    nodes[0] = n0 - 1;
    nodes[1] = n1 - 1;
    nodes[2] = n2 - 1;
    nodes[3] = n3 - 1;
    nodes[4] = id;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell),
        "quad face for qua");
  }

  REIS(1, fscanf(file, "%d\n", &nid), "number of edge groups");
  ref_malloc(count, nid, REF_INT);
  for (id = 1; id <= nid; id++) {
    REIS(1, fscanf(file, "%d\n", &(count[id - 1])), "elements in edge groups");
  }
  for (id = 1; id <= nid; id++) {
    RNS(fgets(line, 1024, file), "read line for first edge node");
    REIS(1, sscanf(line, "%d", &n0), "first edge node");
    for (i = 1; i < count[id - 1]; i++) {
      RNS(fgets(line, 1024, file), "read line for first edge node");
      REIS(1, sscanf(line, "%d", &n1), "next edge node");
      nodes[0] = n0 - 1;
      nodes[1] = n1 - 1;
      nodes[2] = id;
      RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
          "add edge to edg");
      n0 = n1;
    }
  }

  ref_free(count);

  fclose(file);

  return REF_SUCCESS;
}